

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::resetVertexColor(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  string str;
  char buff [200];
  allocator local_119;
  string local_118;
  string local_f8 [32];
  char local_d8 [200];
  
  builtin_strncpy(local_d8,"resetVertexColor\n",0x12);
  std::__cxx11::string::string(local_f8,local_d8,&local_119);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_118,local_f8);
  bVar1 = Connection::sendMsg(this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string(local_f8);
  return bVar1;
}

Assistant:

bool GraphViewer::resetVertexColor() {
	char buff[200];
	sprintf(buff, "resetVertexColor\n");
	string str(buff);
	return con->sendMsg(str);
}